

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cmSystemTools::tokenize
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,string *sep)

{
  bool bVar1;
  value_type local_88;
  value_type local_58;
  long local_38;
  size_type tokstart;
  size_type tokend;
  string *local_20;
  string *sep_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  
  tokend._7_1_ = 0;
  local_20 = sep;
  sep_local = str;
  str_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  tokstart = 0;
  do {
    local_38 = std::__cxx11::string::find_first_not_of((string *)sep_local,(ulong)local_20);
    if (local_38 == -1) break;
    tokstart = std::__cxx11::string::find_first_of((string *)sep_local,(ulong)local_20);
    if (tokstart == 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)sep_local);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_88,(ulong)sep_local);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  } while (tokstart != 0xffffffffffffffff);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(__return_storage_ptr__);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmSystemTools::tokenize(const std::string& str,
                                                 const std::string& sep)
{
  std::vector<std::string> tokens;
  std::string::size_type tokend = 0;

  do {
    std::string::size_type tokstart = str.find_first_not_of(sep, tokend);
    if (tokstart == std::string::npos) {
      break; // no more tokens
    }
    tokend = str.find_first_of(sep, tokstart);
    if (tokend == std::string::npos) {
      tokens.push_back(str.substr(tokstart));
    } else {
      tokens.push_back(str.substr(tokstart, tokend - tokstart));
    }
  } while (tokend != std::string::npos);

  if (tokens.empty()) {
    tokens.emplace_back();
  }
  return tokens;
}